

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManCrossCutTest(Frc_Man_t *p,Vec_Int_t *vOrderInit)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *vOrder;
  int iVar4;
  long lVar5;
  int iVar6;
  
  vOrder = vOrderInit;
  if (vOrderInit == (Vec_Int_t *)0x0) {
    vOrder = Frc_ManCollectCos(p);
  }
  uVar3 = Frc_ManCrossCut(p,vOrder,0);
  printf("CrossCut = %6d\n",(ulong)uVar3);
  uVar3 = Frc_ManCrossCut(p,vOrder,1);
  printf("CrossCut = %6d\n",(ulong)uVar3);
  iVar6 = vOrder->nSize;
  if (1 < iVar6) {
    piVar2 = vOrder->pArray;
    iVar4 = -1;
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      piVar2[lVar5] = piVar2[iVar6 + iVar4];
      piVar2[vOrder->nSize + iVar4] = iVar1;
      lVar5 = lVar5 + 1;
      iVar6 = vOrder->nSize;
      iVar4 = iVar4 + -1;
    } while (lVar5 < iVar6 / 2);
  }
  uVar3 = Frc_ManCrossCut(p,vOrder,0);
  printf("CrossCut = %6d\n",(ulong)uVar3);
  uVar3 = Frc_ManCrossCut(p,vOrder,1);
  printf("CrossCut = %6d\n",(ulong)uVar3);
  iVar6 = vOrder->nSize;
  if (1 < iVar6) {
    piVar2 = vOrder->pArray;
    iVar4 = -1;
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      piVar2[lVar5] = piVar2[iVar6 + iVar4];
      piVar2[vOrder->nSize + iVar4] = iVar1;
      lVar5 = lVar5 + 1;
      iVar6 = vOrder->nSize;
      iVar4 = iVar4 + -1;
    } while (lVar5 < iVar6 / 2);
  }
  if (vOrder != vOrderInit) {
    if (vOrder->pArray != (int *)0x0) {
      free(vOrder->pArray);
    }
    free(vOrder);
    return;
  }
  return;
}

Assistant:

void Frc_ManCrossCutTest( Frc_Man_t * p, Vec_Int_t * vOrderInit )
{
    Vec_Int_t * vOrder;
//    abctime clk = Abc_Clock();
    vOrder = vOrderInit? vOrderInit : Frc_ManCollectCos( p );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    if ( vOrder != vOrderInit )
        Vec_IntFree( vOrder );
//    ABC_PRT( "Time", Abc_Clock() - clk );
}